

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<double>::MultAdd
          (TPZSkylMatrix<double> *this,TPZFMatrix<double> *x,TPZFMatrix<double> *y,
          TPZFMatrix<double> *z,double alpha,double beta,int opt)

{
  double *pdVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZFMatrix<double> *z_00;
  TPZFMatrix<double> *pTVar4;
  double dVar5;
  ostream *poVar6;
  void *this_00;
  int64_t iVar7;
  double **ppdVar8;
  double *pdVar9;
  TPZFMatrix<double> *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZFMatrix<double> *in_RSI;
  TPZBaseMatrix *in_RDI;
  int in_R8D;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double *zp;
  double *diaglast;
  double *diag;
  double *p;
  double val;
  int64_t offset;
  int r;
  int ic;
  int64_t xcols;
  int64_t rows;
  ostream *in_stack_fffffffffffffef8;
  TPZSkylMatrix<double> *in_stack_ffffffffffffff00;
  ostream *in_stack_ffffffffffffff08;
  TPZFMatrix<double> *in_stack_ffffffffffffff10;
  int64_t in_stack_ffffffffffffff30;
  int opt_00;
  double in_stack_ffffffffffffff38;
  TPZFMatrix<double> *in_stack_ffffffffffffff48;
  TPZMatrix<double> *in_stack_ffffffffffffff50;
  double *local_80;
  double *local_70;
  double *local_68;
  double local_60;
  int local_50;
  int local_4c;
  
  if (in_R8D == 0) {
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    if (iVar2 == iVar3) goto LAB_01372e68;
LAB_01372e9a:
    TPZMatrix<double>::Error((char *)alpha,(char *)beta);
  }
  else {
LAB_01372e68:
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    if (iVar2 != iVar3) goto LAB_01372e9a;
  }
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RCX);
  iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
  if (iVar2 == iVar3) {
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RCX);
    iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    if (iVar2 != iVar3) goto LAB_01372f05;
  }
  else {
LAB_01372f05:
    in_stack_ffffffffffffff48 = in_RCX;
    in_stack_ffffffffffffff50 = (TPZMatrix<double> *)TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    (*(in_stack_ffffffffffffff48->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xe])(in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,iVar2);
  }
  z_00 = (TPZFMatrix<double> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  pTVar4 = (TPZFMatrix<double> *)TPZBaseMatrix::Cols(in_RDX);
  if (z_00 == pTVar4) {
    in_stack_ffffffffffffff38 = (double)TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    dVar5 = (double)TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RCX);
    if (in_stack_ffffffffffffff38 == dVar5) {
      in_stack_ffffffffffffff30 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
      iVar2 = TPZBaseMatrix::Rows(in_RDX);
      if (in_stack_ffffffffffffff30 == iVar2) {
        iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
        iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RCX);
        opt_00 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
        if (iVar2 == iVar3) goto LAB_01373136;
      }
    }
  }
  opt_00 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  in_stack_fffffffffffffef8 = std::operator<<((ostream *)&std::cout,"x.Cols = ");
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  poVar6 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffef8,iVar2);
  in_stack_ffffffffffffff00 = (TPZSkylMatrix<double> *)std::operator<<(poVar6," y.Cols()");
  iVar2 = TPZBaseMatrix::Cols(in_RDX);
  poVar6 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff00,iVar2);
  in_stack_ffffffffffffff08 = std::operator<<(poVar6," z.Cols() ");
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RCX);
  poVar6 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff08,iVar2);
  in_stack_ffffffffffffff10 = (TPZFMatrix<double> *)std::operator<<(poVar6," x.Rows() ");
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
  poVar6 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff10,iVar2);
  poVar6 = std::operator<<(poVar6," y.Rows() ");
  iVar2 = TPZBaseMatrix::Rows(in_RDX);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
  poVar6 = std::operator<<(poVar6," z.Rows() ");
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RCX);
  this_00 = (void *)std::ostream::operator<<(poVar6,iVar2);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  TPZMatrix<double>::Error((char *)alpha,(char *)beta);
LAB_01373136:
  TPZMatrix<double>::PrepareZ
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,z_00,in_stack_ffffffffffffff38,
             opt_00);
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  for (local_4c = 0; local_4c < iVar3; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < iVar2; local_50 = local_50 + 1) {
      iVar7 = Size(in_stack_ffffffffffffff00,(int64_t)in_stack_fffffffffffffef8);
      local_60 = 0.0;
      local_68 = TPZFMatrix<double>::g(in_RSI,(local_50 - iVar7) + 1,(long)local_4c);
      ppdVar8 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),(long)local_50);
      local_70 = *ppdVar8 + iVar7;
      ppdVar8 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),(long)local_50);
      pdVar1 = *ppdVar8;
      while (local_70 = local_70 + -1, pdVar1 < local_70) {
        local_60 = *local_70 * *local_68 + local_60;
        local_68 = local_68 + 1;
      }
      if (local_70 == pdVar1) {
        local_60 = *local_70 * *local_68 + local_60;
      }
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08,
                          (int64_t)in_stack_ffffffffffffff00);
      *pdVar9 = local_60 * in_XMM0_Qa + *pdVar9;
      local_80 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08,
                            (int64_t)in_stack_ffffffffffffff00);
      (*(in_RSI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(in_RSI,(long)local_50,(long)local_4c);
      ppdVar8 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 1),(long)local_50);
      local_70 = *ppdVar8 + iVar7;
      while (local_70 = local_70 + -1, pdVar1 < local_70) {
        *local_80 = in_XMM0_Qa * *local_70 * extraout_XMM0_Qa + *local_80;
        local_80 = local_80 + 1;
      }
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	
	if (this->fDecomposed != ENoDecompose) {
        //		DebugStop();
	}
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," <matrixs with incompatible dimensions>" );
	if(z.Rows() != x.Rows() || z.Cols() != x.Cols()) z.Redim(x.Rows(),x.Cols());
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		cout << "x.Cols = " << x.Cols() << " y.Cols()"<< y.Cols() << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows() << " y.Rows() "<< y.Rows() << " z.Rows() "<< z.Rows() << endl;
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);

	const int64_t rows = this->Rows();
	const int64_t xcols = x.Cols();
	for (auto ic = 0; ic < xcols; ic++) {
		for(auto r = 0 ; r < rows ; r++ ) {
			const int64_t offset = Size(r);
			TVar val = 0.;
			const TVar *p = &x.g((r-offset+1),ic);
			TVar *diag = fElem[r] + offset-1;
			const TVar *diaglast = fElem[r];
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) val += *diag-- * *p;
                    else val += std::conj(*diag--) * *p;
                }else{
                    val += *diag-- * *p;
                }
				p ++;
			}
			if( diag == diaglast ) val += *diag * *p;
			z(r,ic) += val*alpha;
			TVar *zp = &z((r-offset+1),ic);
			val = x.GetVal(r,ic);
			diag = fElem[r] + offset-1;
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) *zp += alpha * std::conj(*diag--) * val;
                    else *zp += alpha * *diag-- * val;
                }else{
                    *zp += alpha * *diag-- * val;
                }
                zp ++;
			}
		}
	}
}